

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

void __thiscall
Js::JavascriptStackWalker::GetThis(JavascriptStackWalker *this,Var *pVarThis,int moduleId)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  JavascriptLibrary *pJVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  undefined4 *puVar7;
  CallInfo CVar8;
  CallInfo callInfo;
  int moduleId_local;
  Var *pVarThis_local;
  JavascriptStackWalker *this_local;
  
  if ((*(ushort *)&this->field_0x50 & 1) == 0) {
    CVar8 = GetCallInfo(this,true);
    if (((ulong)CVar8 & 0xffffff) == 0) {
      pJVar4 = ScriptContext::GetLibrary(this->scriptContext);
      pRVar5 = JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
      pvVar6 = Js::JavascriptOperators::OP_GetThis
                         (pRVar5,moduleId,&this->scriptContext->super_ScriptContextInfo);
      *pVarThis = pvVar6;
    }
    else {
      pvVar6 = GetThisFromFrame(this);
      *pVarThis = pvVar6;
    }
  }
  else {
    sVar3 = InlinedFrameWalker::GetArgc(&this->inlinedFrameWalker);
    if (sVar3 == 0) {
      pJVar4 = ScriptContext::GetLibrary(this->scriptContext);
      pRVar5 = JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
      pvVar6 = Js::JavascriptOperators::OP_GetThis
                         (pRVar5,moduleId,&this->scriptContext->super_ScriptContextInfo);
      *pVarThis = pvVar6;
    }
    else {
      pvVar6 = InlinedFrameWalker::GetThisObject(&this->inlinedFrameWalker);
      *pVarThis = pvVar6;
      if (*pVarThis == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0xcb,"(*pVarThis)","*pVarThis");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  if (*pVarThis == (Var)0x0) {
    pJVar4 = ScriptContext::GetLibrary(this->scriptContext);
    pRVar5 = JavascriptLibraryBase::GetNull(&pJVar4->super_JavascriptLibraryBase);
    *pVarThis = pRVar5;
  }
  return;
}

Assistant:

void JavascriptStackWalker::GetThis(Var* pVarThis, int moduleId) const
    {
#if ENABLE_NATIVE_CODEGEN
        if (inlinedFramesBeingWalked)
        {
            if (inlinedFrameWalker.GetArgc() == 0)
            {
                *pVarThis = JavascriptOperators::OP_GetThis(this->scriptContext->GetLibrary()->GetUndefined(), moduleId, scriptContext);
            }
            else
            {
                *pVarThis = inlinedFrameWalker.GetThisObject();
                Assert(*pVarThis);
            }
        }
        else
#endif
        {
            const CallInfo callInfo = this->GetCallInfo();
            if (callInfo.Count == 0)
            {
                *pVarThis = JavascriptOperators::OP_GetThis(scriptContext->GetLibrary()->GetUndefined(), moduleId, scriptContext);
            }
            else
            {
                *pVarThis = this->GetThisFromFrame();
            }
        }

        if (*pVarThis == nullptr)
        {
            *pVarThis = this->scriptContext->GetLibrary()->GetNull();
        }
    }